

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O1

bool P_Thing_Move(int tid,AActor *source,int mapspot,bool fog)

{
  bool bVar1;
  AActor *pAVar2;
  DVector3 local_18;
  
  if (tid != 0) {
    for (source = AActor::TIDHash[tid & 0x7f]; (source != (AActor *)0x0 && (source->tid != tid));
        source = source->inext) {
    }
  }
  if (mapspot == 0) {
    pAVar2 = (AActor *)0x0;
  }
  else {
    for (pAVar2 = AActor::TIDHash[mapspot & 0x7f];
        (pAVar2 != (AActor *)0x0 && (pAVar2->tid != mapspot)); pAVar2 = pAVar2->inext) {
    }
  }
  bVar1 = false;
  if ((source != (AActor *)0x0) && (bVar1 = false, pAVar2 != (AActor *)0x0)) {
    local_18.X = (pAVar2->__Pos).X;
    local_18.Y = (pAVar2->__Pos).Y;
    local_18.Z = (pAVar2->__Pos).Z;
    bVar1 = P_MoveThing(source,&local_18,fog);
  }
  return bVar1;
}

Assistant:

bool P_Thing_Move (int tid, AActor *source, int mapspot, bool fog)
{
	AActor *target;

	if (tid != 0)
	{
		FActorIterator iterator1(tid);
		source = iterator1.Next();
	}
	FActorIterator iterator2 (mapspot);
	target = iterator2.Next ();

	if (source != NULL && target != NULL)
	{
		return P_MoveThing(source, target->Pos(), fog);
	}
	return false;
}